

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O0

REF_STATUS ref_smooth_meshlink_face_improve(REF_GRID ref_grid,REF_INT node)

{
  REF_DBL *pRVar1;
  REF_NODE pRVar2;
  REF_INTERP pRVar3;
  uint uVar4;
  uint uVar5;
  int local_11c;
  int local_118;
  int local_114;
  REF_STATUS ref_private_macro_code_rxs_2;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rxs_1;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS ref_private_macro_code_rxs;
  REF_INTERP ref_interp;
  REF_INT interp_guess;
  REF_STATUS interp_status;
  REF_BOOL geom_face;
  REF_BOOL allowed;
  REF_INT ids [2];
  REF_INT n_ids;
  REF_INT ixyz;
  REF_DBL normdev_orig;
  REF_DBL normdev;
  REF_DBL max_ratio;
  REF_DBL min_ratio;
  REF_DBL tet_quality;
  REF_DBL tri_quality;
  REF_DBL tri_quality0;
  REF_DBL backoff;
  REF_DBL original [3];
  REF_DBL local_48;
  REF_DBL ideal [3];
  REF_INT tries;
  REF_NODE ref_node;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  pRVar2 = ref_grid->node;
  pRVar3 = ref_grid->interp;
  if (ref_grid->geom->meshlink == (void *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x478,
           "ref_smooth_meshlink_face_improve","expect meshlink");
    ref_grid_local._4_4_ = 1;
  }
  else {
    if ((node < 0) || (ref_grid->cell[6]->ref_adj->nnode <= node)) {
      local_114 = -1;
    }
    else {
      local_114 = ref_grid->cell[6]->ref_adj->first[node];
    }
    if (local_114 == -1) {
      if ((node < 0) || (ref_grid->cell[0]->ref_adj->nnode <= node)) {
        local_118 = -1;
      }
      else {
        local_118 = ref_grid->cell[0]->ref_adj->first[node];
      }
      if (local_118 == -1) {
        ref_grid_local._4_4_ = ref_cell_id_list_around(ref_grid->cell[3],node,2,ids,&geom_face);
        if ((ref_grid_local._4_4_ == 0) || (ref_grid_local._4_4_ == 7)) {
          if (ids[0] < 2) {
            ref_grid_local._4_4_ = ref_geom_is_a(ref_grid->geom,node,2,&interp_guess);
            if (ref_grid_local._4_4_ == 0) {
              if (interp_guess == 0) {
                ref_grid_local._4_4_ = 0;
              }
              else {
                for (ids[1] = 0; ids[1] < 3; ids[1] = ids[1] + 1) {
                  original[(long)ids[1] + -1] = pRVar2->real[ids[1] + node * 0xf];
                }
                ref_interp._0_4_ = -1;
                if ((pRVar3 != (REF_INTERP)0x0) && (pRVar3->continuously != 0)) {
                  ref_interp._0_4_ = pRVar3->cell[node];
                }
                ref_grid_local._4_4_ = ref_smooth_tri_quality_around(ref_grid,node,&tri_quality);
                if (ref_grid_local._4_4_ == 0) {
                  ref_grid_local._4_4_ =
                       ref_smooth_tri_normdev_around(ref_grid,node,(REF_DBL *)&n_ids);
                  if (ref_grid_local._4_4_ == 0) {
                    ref_grid_local._4_4_ =
                         ref_smooth_tri_ratio_around(ref_grid,node,&max_ratio,&normdev);
                    if (ref_grid_local._4_4_ == 0) {
                      if (((tri_quality < 0.5) || (max_ratio < 0.5)) || (2.0 < normdev)) {
                        uVar4 = ref_smooth_tri_weighted_ideal(ref_grid,node,&local_48);
                        if (uVar4 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                 ,0x498,"ref_smooth_meshlink_face_improve",(ulong)uVar4,"ideal");
                          return uVar4;
                        }
                      }
                      else {
                        uVar4 = ref_smooth_tri_pliant(ref_grid,node,&local_48);
                        if (uVar4 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                 ,0x49a,"ref_smooth_meshlink_face_improve",(ulong)uVar4,"ideal");
                          return uVar4;
                        }
                      }
                      tri_quality0 = 1.0;
                      for (ideal[2]._4_4_ = 0; ideal[2]._4_4_ < 8;
                          ideal[2]._4_4_ = ideal[2]._4_4_ + 1) {
                        for (ids[1] = 0; ids[1] < 3; ids[1] = ids[1] + 1) {
                          pRVar2->real[ids[1] + node * 0xf] =
                               tri_quality0 * ideal[(long)ids[1] + -1] +
                               (1.0 - tri_quality0) * original[(long)ids[1] + -1];
                        }
                        uVar4 = ref_geom_constrain(ref_grid,node);
                        if (uVar4 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                 ,0x4a2,"ref_smooth_meshlink_face_improve",(ulong)uVar4,"constrain")
                          ;
                          return uVar4;
                        }
                        uVar4 = ref_metric_interpolate_node(ref_grid,node);
                        if ((uVar4 != 0) && (uVar4 != 5)) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                 ,0x4a4,"ref_smooth_meshlink_face_improve",(ulong)uVar4,
                                 "ref_metric_interpolate_node failed");
                          return uVar4;
                        }
                        if (uVar4 == 0) {
                          uVar5 = ref_smooth_valid_no_geom_tri(ref_grid,node,&interp_status);
                          if (uVar5 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                   ,0x4a6,"ref_smooth_meshlink_face_improve",(ulong)uVar5,"twod tri"
                                  );
                            return uVar5;
                          }
                          uVar5 = ref_smooth_tri_quality_around(ref_grid,node,&tet_quality);
                          if (uVar5 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                   ,0x4a7,"ref_smooth_meshlink_face_improve",(ulong)uVar5,"q");
                            return uVar5;
                          }
                          uVar5 = ref_smooth_tri_normdev_around(ref_grid,node,&normdev_orig);
                          if (uVar5 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                   ,0x4a8,"ref_smooth_meshlink_face_improve",(ulong)uVar5,"nd");
                            return uVar5;
                          }
                          uVar5 = ref_smooth_tri_ratio_around(ref_grid,node,&max_ratio,&normdev);
                          if (uVar5 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                   ,0x4aa,"ref_smooth_meshlink_face_improve",(ulong)uVar5,"ratio");
                            return uVar5;
                          }
                          if ((((interp_status != 0) && (tri_quality < tet_quality)) &&
                              ((ref_grid->adapt->post_min_ratio <= max_ratio &&
                               (normdev <= ref_grid->adapt->post_max_ratio)))) &&
                             ((pRVar1 = &ref_grid->adapt->post_min_normdev,
                              *pRVar1 <= normdev_orig && normdev_orig != *pRVar1 ||
                              (_n_ids < normdev_orig)))) {
                            if ((node < 0) || (ref_grid->cell[8]->ref_adj->nnode <= node)) {
                              local_11c = -1;
                            }
                            else {
                              local_11c = ref_grid->cell[8]->ref_adj->first[node];
                            }
                            if (local_11c == -1) {
                              return 0;
                            }
                            uVar5 = ref_smooth_tet_quality_around(ref_grid,node,&min_ratio);
                            if (uVar5 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                     ,0x4b3,"ref_smooth_meshlink_face_improve",(ulong)uVar5,"q");
                              return uVar5;
                            }
                            uVar5 = ref_smooth_tet_ratio_around(ref_grid,node,&max_ratio,&normdev);
                            if (uVar5 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                     ,0x4b6,"ref_smooth_meshlink_face_improve",(ulong)uVar5,"ratio")
                              ;
                              return uVar5;
                            }
                            pRVar1 = &ref_grid->adapt->smooth_min_quality;
                            if (((*pRVar1 <= min_ratio && min_ratio != *pRVar1) &&
                                (ref_grid->adapt->post_min_ratio <= max_ratio)) &&
                               (normdev <= ref_grid->adapt->post_max_ratio)) {
                              return 0;
                            }
                          }
                        }
                        tri_quality0 = tri_quality0 * 0.5;
                        if (((REF_INT)ref_interp != -1) && (uVar4 != 0)) {
                          pRVar3->cell[node] = (REF_INT)ref_interp;
                        }
                      }
                      for (ids[1] = 0; ids[1] < 3; ids[1] = ids[1] + 1) {
                        pRVar2->real[ids[1] + node * 0xf] = original[(long)ids[1] + -1];
                      }
                      ref_grid_local._4_4_ = ref_metric_interpolate_node(ref_grid,node);
                      if ((ref_grid_local._4_4_ == 0) || (ref_grid_local._4_4_ == 5)) {
                        ref_grid_local._4_4_ = 0;
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                               ,0x4c7,"ref_smooth_meshlink_face_improve",(ulong)ref_grid_local._4_4_
                               ,"interp");
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                             ,0x495,"ref_smooth_meshlink_face_improve",(ulong)ref_grid_local._4_4_,
                             "ratio");
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                           ,0x493,"ref_smooth_meshlink_face_improve",(ulong)ref_grid_local._4_4_,
                           "nd_orig");
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                         ,0x492,"ref_smooth_meshlink_face_improve",(ulong)ref_grid_local._4_4_,"q");
                }
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x486,"ref_smooth_meshlink_face_improve",(ulong)ref_grid_local._4_4_,
                     "face check");
            }
          }
          else {
            ref_grid_local._4_4_ = 0;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x481,"ref_smooth_meshlink_face_improve",(ulong)ref_grid_local._4_4_,
                 "count faceids");
        }
      }
      else {
        ref_grid_local._4_4_ = 0;
      }
    }
    else {
      ref_grid_local._4_4_ = 0;
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_meshlink_face_improve(REF_GRID ref_grid,
                                                           REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT tries;
  REF_DBL ideal[3], original[3];
  REF_DBL backoff, tri_quality0, tri_quality, tet_quality, min_ratio, max_ratio;
  REF_DBL normdev, normdev_orig;
  REF_INT ixyz;
  REF_INT n_ids, ids[2];
  REF_BOOL allowed, geom_face;
  REF_STATUS interp_status;
  REF_INT interp_guess;
  REF_INTERP ref_interp = ref_grid_interp(ref_grid);

  RAS(ref_geom_meshlinked(ref_grid_geom(ref_grid)), "expect meshlink");

  /* can't handle mixed elements */
  if (!ref_cell_node_empty(ref_grid_qua(ref_grid), node)) return REF_SUCCESS;
  /* won't keep an edg straight */
  if (!ref_cell_node_empty(ref_grid_edg(ref_grid), node)) return REF_SUCCESS;

  /* don't move edge nodes */
  RXS(ref_cell_id_list_around(ref_grid_tri(ref_grid), node, 2, &n_ids, ids),
      REF_INCREASE_LIMIT, "count faceids");
  if (n_ids > 1) return REF_SUCCESS;

  /* face geom support */
  RSS(ref_geom_is_a(ref_grid_geom(ref_grid), node, REF_GEOM_FACE, &geom_face),
      "face check");
  if (!geom_face) return REF_SUCCESS;

  for (ixyz = 0; ixyz < 3; ixyz++)
    original[ixyz] = ref_node_xyz(ref_node, ixyz, node);
  interp_guess = REF_EMPTY;
  if (NULL != ref_interp) {
    if (ref_interp_continuously(ref_interp)) {
      interp_guess = ref_interp_cell(ref_interp, node);
    }
  }

  RSS(ref_smooth_tri_quality_around(ref_grid, node, &tri_quality0), "q");
  RSS(ref_smooth_tri_normdev_around(ref_grid, node, &normdev_orig), "nd_orig");
  RSS(ref_smooth_tri_ratio_around(ref_grid, node, &min_ratio, &max_ratio),
      "ratio");

  if (tri_quality0 < 0.5 || min_ratio < 0.5 || max_ratio > 2.0) {
    RSS(ref_smooth_tri_weighted_ideal(ref_grid, node, ideal), "ideal");
  } else {
    RSS(ref_smooth_tri_pliant(ref_grid, node, ideal), "ideal");
  }

  backoff = 1.0;
  for (tries = 0; tries < 8; tries++) {
    for (ixyz = 0; ixyz < 3; ixyz++)
      ref_node_xyz(ref_node, ixyz, node) =
          backoff * ideal[ixyz] + (1.0 - backoff) * original[ixyz];
    RSS(ref_geom_constrain(ref_grid, node), "constrain");
    interp_status = ref_metric_interpolate_node(ref_grid, node);
    RXS(interp_status, REF_NOT_FOUND, "ref_metric_interpolate_node failed");
    if (REF_SUCCESS == interp_status) {
      RSS(ref_smooth_valid_no_geom_tri(ref_grid, node, &allowed), "twod tri");
      RSS(ref_smooth_tri_quality_around(ref_grid, node, &tri_quality), "q");
      RSS(ref_smooth_tri_normdev_around(ref_grid, node, &normdev), "nd");
      RSS(ref_smooth_tri_ratio_around(ref_grid, node, &min_ratio, &max_ratio),
          "ratio");
      if (allowed && (tri_quality > tri_quality0) &&
          (min_ratio >= ref_grid_adapt(ref_grid, post_min_ratio)) &&
          (max_ratio <= ref_grid_adapt(ref_grid, post_max_ratio)) &&
          (normdev > ref_grid_adapt(ref_grid, post_min_normdev) ||
           normdev > normdev_orig)) {
        if (ref_cell_node_empty(ref_grid_tet(ref_grid), node)) {
          return REF_SUCCESS;
        } else {
          RSS(ref_smooth_tet_quality_around(ref_grid, node, &tet_quality), "q");
          RSS(ref_smooth_tet_ratio_around(ref_grid, node, &min_ratio,
                                          &max_ratio),
              "ratio");
          if ((REF_SUCCESS == interp_status) &&
              (tet_quality > ref_grid_adapt(ref_grid, smooth_min_quality)) &&
              (min_ratio >= ref_grid_adapt(ref_grid, post_min_ratio)) &&
              (max_ratio <= ref_grid_adapt(ref_grid, post_max_ratio))) {
            return REF_SUCCESS;
          }
        }
      }
    }
    backoff *= 0.5;
    if (REF_EMPTY != interp_guess && REF_SUCCESS != interp_status)
      ref_interp_cell(ref_interp, node) = interp_guess;
  }

  for (ixyz = 0; ixyz < 3; ixyz++)
    ref_node_xyz(ref_node, ixyz, node) = original[ixyz];
  RXS(ref_metric_interpolate_node(ref_grid, node), REF_NOT_FOUND, "interp");

  return REF_SUCCESS;
}